

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::GetShortPathToFile(string *__return_storage_ptr__,cmCTest *this,string *cfname)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_181;
  string *local_180;
  string *res;
  undefined1 local_170 [6];
  bool inBld;
  bool inSrc;
  string bldRelpath;
  string srcRelpath;
  string fname;
  string local_108;
  string local_e8;
  string local_c8;
  string *local_a8;
  string *buildDir;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  string *local_28;
  string *sourceDir;
  string *cfname_local;
  cmCTest *this_local;
  string *path;
  
  sourceDir = cfname;
  cfname_local = (string *)this;
  this_local = (cmCTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"SourceDirectory",&local_89);
  GetCTestConfiguration(&local_68,this,&local_88);
  cmsys::SystemTools::CollapseFullPath(&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_28 = &local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"BuildDirectory",
             (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
  GetCTestConfiguration(&local_e8,this,&local_108);
  cmsys::SystemTools::CollapseFullPath(&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
  local_a8 = &local_c8;
  cmsys::SystemTools::CollapseFullPath((string *)((long)&srcRelpath.field_2 + 8),sourceDir);
  cmSystemTools::RelativePath
            ((string *)((long)&bldRelpath.field_2 + 8),local_28,
             (string *)((long)&srcRelpath.field_2 + 8));
  cmSystemTools::RelativePath
            ((string *)local_170,local_a8,(string *)((long)&srcRelpath.field_2 + 8));
  lVar1 = std::__cxx11::string::find(bldRelpath.field_2._M_local_buf + 8,0x116e474);
  res._7_1_ = lVar1 == -1;
  lVar1 = std::__cxx11::string::find(local_170,0x116e474);
  res._6_1_ = lVar1 == -1;
  local_180 = (string *)0x0;
  if (((res._7_1_ & 1) == 0) || (!(bool)res._6_1_)) {
    if ((res._7_1_ & 1) == 0) {
      if ((bool)res._6_1_) {
        local_180 = (string *)local_170;
      }
    }
    else {
      local_180 = (string *)((long)&bldRelpath.field_2 + 8);
    }
  }
  else {
    uVar2 = std::__cxx11::string::size();
    uVar3 = std::__cxx11::string::size();
    if (uVar2 < uVar3) {
      local_180 = (string *)((long)&bldRelpath.field_2 + 8);
    }
    else {
      local_180 = (string *)local_170;
    }
  }
  local_181 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_180 == (string *)0x0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(srcRelpath.field_2._M_local_buf + 8));
  }
  else {
    cmsys::SystemTools::ConvertToUnixSlashes(local_180);
    std::operator+(&local_1a8,"./",local_180);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    pcVar4 = (char *)std::__cxx11::string::back();
    if (*pcVar4 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","_");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","_");
  local_181 = 1;
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)(bldRelpath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(srcRelpath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetShortPathToFile(const std::string& cfname)
{
  const std::string& sourceDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("SourceDirectory"));
  const std::string& buildDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("BuildDirectory"));
  std::string fname = cmSystemTools::CollapseFullPath(cfname);

  // Find relative paths to both directories
  std::string srcRelpath = cmSystemTools::RelativePath(sourceDir, fname);
  std::string bldRelpath = cmSystemTools::RelativePath(buildDir, fname);

  // If any contains "." it is not parent directory
  bool inSrc = srcRelpath.find("..") == std::string::npos;
  bool inBld = bldRelpath.find("..") == std::string::npos;
  // TODO: Handle files with .. in their name

  std::string* res = nullptr;

  if (inSrc && inBld) {
    // If both have relative path with no dots, pick the shorter one
    if (srcRelpath.size() < bldRelpath.size()) {
      res = &srcRelpath;
    } else {
      res = &bldRelpath;
    }
  } else if (inSrc) {
    res = &srcRelpath;
  } else if (inBld) {
    res = &bldRelpath;
  }

  std::string path;

  if (!res) {
    path = fname;
  } else {
    cmSystemTools::ConvertToUnixSlashes(*res);

    path = "./" + *res;
    if (path.back() == '/') {
      path.resize(path.size() - 1);
    }
  }

  cmsys::SystemTools::ReplaceString(path, ":", "_");
  cmsys::SystemTools::ReplaceString(path, " ", "_");
  return path;
}